

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

uint GetErrorLocationLineNumber(char *codeStart,char *errorPos)

{
  char *local_30;
  char *pos;
  int line;
  char *errorPos_local;
  char *codeStart_local;
  
  if (codeStart == (char *)0x0) {
    codeStart_local._4_4_ = 0;
  }
  else if (errorPos == (char *)0x0) {
    codeStart_local._4_4_ = 0;
  }
  else {
    pos._4_4_ = 1;
    for (local_30 = codeStart; local_30 < errorPos; local_30 = local_30 + 1) {
      pos._4_4_ = (*local_30 == '\n') + pos._4_4_;
    }
    codeStart_local._4_4_ = pos._4_4_;
  }
  return codeStart_local._4_4_;
}

Assistant:

unsigned GetErrorLocationLineNumber(const char *codeStart, const char *errorPos)
{
	if(!codeStart)
		return 0;

	if(!errorPos)
		return 0;

	int line = 1;
	for(const char *pos = codeStart; pos < errorPos; pos++)
		line += *pos == '\n';

	return line;
}